

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation.cpp
# Opt level: O1

void __thiscall indigox::ElectronOpt::DetermineElectronsToAdd(ElectronOpt *this)

{
  long *plVar1;
  element_type *peVar2;
  element_type *peVar3;
  undefined8 *puVar4;
  element_type *peVar5;
  AdjList *g_1;
  StoredVertexList *pSVar6;
  runtime_error *this_00;
  long *plVar7;
  uint32_t uVar8;
  AdjList *g;
  long local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  peVar2 = (this->molGraph_).super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this->electronsToAdd_ = -(int)peVar2->totalCharge_;
  peVar3 = (peVar2->super__MolGraph).graph_.
           super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::MolVertProp,_indigox::MolEdgeProp,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  for (puVar4 = *(undefined8 **)
                 &((StoredVertexList *)((long)&peVar3->super_type + 0x18))->
                  super__List_base<void_*,_std::allocator<void_*>_>;
      (StoredVertexList *)puVar4 != (StoredVertexList *)((long)&peVar3->super_type + 0x18U);
      puVar4 = (undefined8 *)*puVar4) {
    Atom::GetElement(*(Atom **)(puVar4[2] + 0x30));
    this->electronsToAdd_ = this->electronsToAdd_ + (uint)*(byte *)(local_30 + 0x43);
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
  }
  peVar5 = (((this->elnGraph_).
             super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super__ElnGraph).graph_.
           super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  plVar7 = *(long **)&((StoredVertexList *)((long)&peVar5->super_type + 0x18))->
                      super__List_base<void_*,_std::allocator<void_*>_>;
  pSVar6 = (StoredVertexList *)((long)&peVar5->super_type + 0x18);
  if ((StoredVertexList *)plVar7 != pSVar6) {
    uVar8 = this->electronsToAdd_;
    do {
      plVar1 = plVar7 + 2;
      plVar7 = (long *)*plVar7;
      uVar8 = uVar8 - *(byte *)(*plVar1 + 0x47);
    } while ((StoredVertexList *)plVar7 != pSVar6);
    this->electronsToAdd_ = uVar8;
  }
  if (Options::AssignElectrons::AUTO_USE_ELECTRON_PAIRS == true) {
    Options::AssignElectrons::USE_ELECTRON_PAIRS = (bool)(~(byte)this->electronsToAdd_ & 1);
  }
  if (Options::AssignElectrons::USE_ELECTRON_PAIRS == true) {
    if ((this->electronsToAdd_ & 1) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Unable to handle odd number of electrons when using electron pairs.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->electronsToAdd_ = this->electronsToAdd_ >> 1;
  }
  return;
}

Assistant:

void ElectronOpt::DetermineElectronsToAdd() {
  electronsToAdd_ = -molGraph_->GetTotalCharge();
  MolVertIterPair vs = molGraph_->GetVertices();
  for (MolVertexIter v = vs.first; v != vs.second; ++v)
    electronsToAdd_ += molGraph_->GetProperties(*v)->atom->GetElement()->GetValenceElectronCount();
  // All bonds should have order of at least 1
  // Preplace code
  ElnVertIterPair elnvs = elnGraph_->GetVertices();
  for (; elnvs.first != elnvs.second; ++elnvs.first)
    electronsToAdd_ -= elnGraph_->GetProperties(*elnvs.first)->pre_placed;
  //electronsToAdd_ -= 2 * molGraph_->NumEdges();
  // End Preplace code
  
  if (opt_::AUTO_USE_ELECTRON_PAIRS && electronsToAdd_ % 2)
    opt_::USE_ELECTRON_PAIRS = false;
  else if (opt_::AUTO_USE_ELECTRON_PAIRS)
    opt_::USE_ELECTRON_PAIRS = true;
  
  if (opt_::USE_ELECTRON_PAIRS && electronsToAdd_ % 2)
    throw std::runtime_error("Unable to handle odd number of electrons when using electron pairs.");
  else if (opt_::USE_ELECTRON_PAIRS)
    electronsToAdd_ /= 2;
}